

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Node * stmt(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_MemoryAllocator *allocator;
  _Bool _Var1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  C_Token *pCVar4;
  char *pcVar5;
  C_Node *pCVar6;
  ulong uVar7;
  ulong uVar8;
  C_Scope *pCVar9;
  C_Type *pCVar10;
  char *pcVar11;
  size_t __n;
  C_Node *node;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  C_Token *local_50;
  char *local_48;
  char *pcStack_40;
  
  local_50 = tok;
  _Var1 = C_equal(tok,"return");
  if (_Var1) {
    pCVar2 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar2->kind = ND_RETURN;
    pCVar2->tok = tok;
    _Var1 = C_consume(rest,tok->next,";");
    if (_Var1) {
      return pCVar2;
    }
    pCVar3 = expr(parser,&local_50,tok->next);
    pCVar4 = C_skip(parser,local_50,";");
    *rest = pCVar4;
    C_add_type(parser,pCVar3);
    pCVar10 = parser->current_fn->ty->return_ty;
    if ((pCVar10->kind & ~TY_BOOL) != TY_STRUCT) {
      pCVar3 = C_new_cast(parser,pCVar3,pCVar10);
    }
    pCVar2->lhs = pCVar3;
    return pCVar2;
  }
  _Var1 = C_equal(tok,"if");
  if (_Var1) {
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_IF;
    pCVar3->tok = tok;
    local_50 = C_skip(parser,tok->next,"(");
    pCVar2 = expr(parser,&local_50,local_50);
    pCVar3->cond = pCVar2;
    local_50 = C_skip(parser,local_50,")");
    pCVar2 = stmt(parser,&local_50,local_50);
    pCVar3->then = pCVar2;
    _Var1 = C_equal(local_50,"else");
    if (_Var1) {
      pCVar2 = stmt(parser,&local_50,local_50->next);
      pCVar3->els = pCVar2;
    }
LAB_0012c2ec:
    *rest = local_50;
  }
  else {
    _Var1 = C_equal(tok,"switch");
    if (_Var1) {
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_SWITCH;
      pCVar3->tok = tok;
      local_50 = C_skip(parser,tok->next,"(");
      pCVar2 = expr(parser,&local_50,local_50);
      pCVar3->cond = pCVar2;
      pCVar4 = C_skip(parser,local_50,")");
      pcVar11 = parser->brk_label;
      pCVar2 = parser->current_switch;
      parser->current_switch = pCVar3;
      pcVar5 = new_unique_name(parser->memory_allocator);
      pCVar3->brk_label = pcVar5;
      parser->brk_label = pcVar5;
      pCVar6 = stmt(parser,rest,pCVar4);
      pCVar3->then = pCVar6;
      parser->current_switch = pCVar2;
      parser->brk_label = pcVar11;
      return pCVar3;
    }
    _Var1 = C_equal(tok,"case");
    if (_Var1) {
      if (parser->current_switch != (C_Node *)0x0) {
        pCVar2 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar2->kind = ND_CASE;
        pCVar2->tok = tok;
        pCVar3 = conditional(parser,&local_50,tok->next);
        uVar7 = eval2(parser,pCVar3,(char ***)0x0);
        _Var1 = C_equal(local_50,"...");
        uVar8 = uVar7;
        if (_Var1) {
          pCVar3 = conditional(parser,&local_50,local_50->next);
          uVar8 = eval2(parser,pCVar3,(char ***)0x0);
          if ((int)uVar8 < (int)uVar7) {
            pcVar11 = "empty case range specified";
            tok = local_50;
            goto LAB_0012cbdd;
          }
        }
        local_50 = C_skip(parser,local_50,":");
        pcVar11 = new_unique_name(parser->memory_allocator);
        pCVar2->label = pcVar11;
        pCVar3 = stmt(parser,rest,local_50);
        pCVar2->lhs = pCVar3;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar8;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar7;
        auVar12 = vpunpcklqdq_avx(auVar13,auVar12);
        auVar12 = vpsllq_avx(auVar12,0x20);
        auVar12 = vpsraq_avx512vl(auVar12,0x20);
        pCVar2->begin = auVar12._0_8_;
        pCVar2->end = auVar12._8_8_;
        pCVar3 = parser->current_switch;
        pCVar2->case_next = pCVar3->case_next;
        pCVar3->case_next = pCVar2;
        return pCVar2;
      }
      pcVar11 = "stray case";
LAB_0012cbdd:
      C_error_tok(parser,tok,pcVar11);
    }
    _Var1 = C_equal(tok,"default");
    if (_Var1) {
      if (parser->current_switch != (C_Node *)0x0) {
        pCVar2 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar2->kind = ND_CASE;
        pCVar2->tok = tok;
        pCVar4 = C_skip(parser,tok->next,":");
        pcVar11 = new_unique_name(parser->memory_allocator);
        pCVar2->label = pcVar11;
        pCVar3 = stmt(parser,rest,pCVar4);
        pCVar2->lhs = pCVar3;
        parser->current_switch->default_case = pCVar2;
        return pCVar2;
      }
      pcVar11 = "stray default";
      goto LAB_0012cbdd;
    }
    _Var1 = C_equal(tok,"for");
    if (_Var1) {
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_FOR;
      pCVar3->tok = tok;
      local_50 = C_skip(parser,tok->next,"(");
      pCVar9 = (C_Scope *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x38);
      allocator = parser->memory_allocator;
      (pCVar9->vars).allocator = allocator;
      (pCVar9->tags).allocator = allocator;
      pCVar9->next = parser->scope;
      parser->scope = pCVar9;
      local_48 = parser->brk_label;
      pcStack_40 = parser->cont_label;
      pcVar11 = new_unique_name(allocator);
      pCVar3->brk_label = pcVar11;
      parser->brk_label = pcVar11;
      pcVar11 = new_unique_name(parser->memory_allocator);
      pCVar4 = local_50;
      pCVar3->cont_label = pcVar11;
      parser->cont_label = pcVar11;
      _Var1 = is_typename(parser,local_50);
      if (_Var1) {
        pCVar10 = declspec(parser,&local_50,pCVar4,(VarAttr *)0x0);
        pCVar2 = declaration(parser,&local_50,local_50,pCVar10,(VarAttr *)0x0);
      }
      else {
        pCVar2 = expr_stmt(parser,&local_50,pCVar4);
      }
      pCVar4 = local_50;
      pCVar3->init = pCVar2;
      _Var1 = C_equal(local_50,";");
      if (!_Var1) {
        pCVar2 = expr(parser,&local_50,pCVar4);
        pCVar3->cond = pCVar2;
        pCVar4 = local_50;
      }
      pCVar4 = C_skip(parser,pCVar4,";");
      local_50 = pCVar4;
      _Var1 = C_equal(pCVar4,")");
      if (!_Var1) {
        pCVar2 = expr(parser,&local_50,pCVar4);
        pCVar3->inc = pCVar2;
        pCVar4 = local_50;
      }
      local_50 = C_skip(parser,pCVar4,")");
      pCVar2 = stmt(parser,rest,local_50);
      pCVar3->then = pCVar2;
      parser->scope = parser->scope->next;
    }
    else {
      _Var1 = C_equal(tok,"while");
      if (!_Var1) {
        _Var1 = C_equal(tok,"do");
        if (_Var1) {
          pCVar3 = (C_Node *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          pCVar3->kind = ND_DO;
          pCVar3->tok = tok;
          local_48 = parser->brk_label;
          pcStack_40 = parser->cont_label;
          pcVar11 = new_unique_name(parser->memory_allocator);
          pCVar3->brk_label = pcVar11;
          parser->brk_label = pcVar11;
          pcVar11 = new_unique_name(parser->memory_allocator);
          pCVar3->cont_label = pcVar11;
          parser->cont_label = pcVar11;
          pCVar2 = stmt(parser,&local_50,tok->next);
          pCVar3->then = pCVar2;
          parser->brk_label = local_48;
          parser->cont_label = pcStack_40;
          local_50 = C_skip(parser,local_50,"while");
          local_50 = C_skip(parser,local_50,"(");
          pCVar2 = expr(parser,&local_50,local_50);
          pCVar3->cond = pCVar2;
          local_50 = C_skip(parser,local_50,")");
          pCVar4 = local_50;
        }
        else {
          _Var1 = C_equal(tok,"asm");
          if (_Var1) {
            pCVar2 = asm_stmt(parser,rest,tok);
            return pCVar2;
          }
          _Var1 = C_equal(tok,"goto");
          if (_Var1) {
            _Var1 = C_equal(tok->next,"*");
            pCVar3 = (C_Node *)
                     (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
            if (_Var1) {
              pCVar3->kind = ND_GOTO_EXPR;
              pCVar3->tok = tok;
              pCVar2 = expr(parser,&local_50,tok->next->next);
              pCVar3->lhs = pCVar2;
              pCVar4 = local_50;
            }
            else {
              pCVar3->kind = ND_GOTO;
              pCVar3->tok = tok;
              pcVar11 = get_ident(parser,tok->next);
              pCVar3->label = pcVar11;
              pCVar3->goto_next = parser->gotos;
              parser->gotos = pCVar3;
              pCVar4 = tok->next->next;
            }
          }
          else {
            _Var1 = C_equal(tok,"break");
            if (_Var1) {
              if (parser->brk_label == (char *)0x0) {
                pcVar11 = "stray break";
                goto LAB_0012cbdd;
              }
              pCVar3 = (C_Node *)
                       (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
              pCVar3->kind = ND_GOTO;
              pCVar3->tok = tok;
              pcVar11 = parser->brk_label;
            }
            else {
              _Var1 = C_equal(tok,"continue");
              if (!_Var1) {
                if ((tok->kind == TK_IDENT) && (_Var1 = C_equal(tok->next,":"), _Var1)) {
                  pCVar2 = (C_Node *)
                           (*parser->memory_allocator->calloc)
                                     (parser->memory_allocator->arena,1,0x120);
                  pCVar2->kind = ND_LABEL;
                  pCVar2->tok = tok;
                  pcVar11 = tok->loc;
                  __n = (size_t)tok->len;
                  pcVar5 = (char *)(*parser->memory_allocator->calloc)
                                             (parser->memory_allocator->arena,__n + 1,1);
                  memcpy(pcVar5,pcVar11,__n);
                  pcVar5[__n] = '\0';
                  pCVar2->label = pcVar5;
                  pcVar11 = new_unique_name(parser->memory_allocator);
                  pCVar2->unique_label = pcVar11;
                  pCVar3 = stmt(parser,rest,local_50->next->next);
                  pCVar2->lhs = pCVar3;
                  pCVar2->goto_next = parser->labels;
                  parser->labels = pCVar2;
                  return pCVar2;
                }
                _Var1 = C_equal(tok,"{");
                if (_Var1) {
                  pCVar2 = compound_stmt(parser,rest,tok->next);
                  return pCVar2;
                }
                pCVar2 = expr_stmt(parser,rest,tok);
                return pCVar2;
              }
              if (parser->cont_label == (char *)0x0) {
                pcVar11 = "stray continue";
                goto LAB_0012cbdd;
              }
              pCVar3 = (C_Node *)
                       (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
              pCVar3->kind = ND_GOTO;
              pCVar3->tok = tok;
              pcVar11 = parser->cont_label;
            }
            pCVar3->unique_label = pcVar11;
            pCVar4 = tok->next;
          }
        }
        local_50 = C_skip(parser,pCVar4,";");
        goto LAB_0012c2ec;
      }
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_FOR;
      pCVar3->tok = tok;
      local_50 = C_skip(parser,tok->next,"(");
      pCVar2 = expr(parser,&local_50,local_50);
      pCVar3->cond = pCVar2;
      pCVar4 = C_skip(parser,local_50,")");
      local_48 = parser->brk_label;
      pcStack_40 = parser->cont_label;
      pcVar11 = new_unique_name(parser->memory_allocator);
      pCVar3->brk_label = pcVar11;
      parser->brk_label = pcVar11;
      pcVar11 = new_unique_name(parser->memory_allocator);
      pCVar3->cont_label = pcVar11;
      parser->cont_label = pcVar11;
      pCVar2 = stmt(parser,rest,pCVar4);
      pCVar3->then = pCVar2;
    }
    parser->brk_label = local_48;
    parser->cont_label = pcStack_40;
  }
  return pCVar3;
}

Assistant:

static C_Node *stmt(C_Parser *parser, C_Token **rest, C_Token *tok) {
  if (C_equal(tok, "return")) {
    C_Node *node = new_node(parser, ND_RETURN, tok);
    if (C_consume(rest, tok->next, ";"))
      return node;

    C_Node *exp = expr(parser, &tok, tok->next);
    *rest = C_skip(parser, tok, ";");

    C_add_type(parser, exp);
    C_Type *ty = parser->current_fn->ty->return_ty;
    if (ty->kind != TY_STRUCT && ty->kind != TY_UNION)
      exp = C_new_cast(parser, exp, parser->current_fn->ty->return_ty);

    node->lhs = exp;
    return node;
  }

  if (C_equal(tok, "if")) {
    C_Node *node = new_node(parser, ND_IF, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");
    node->then = stmt(parser, &tok, tok);
    if (C_equal(tok, "else"))
      node->els = stmt(parser, &tok, tok->next);
    *rest = tok;
    return node;
  }

  if (C_equal(tok, "switch")) {
    C_Node *node = new_node(parser, ND_SWITCH, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    C_Node *sw = parser->current_switch;
    parser->current_switch = node;

    char *brk = parser->brk_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, rest, tok);

    parser->current_switch = sw;
    parser->brk_label = brk;
    return node;
  }

  if (C_equal(tok, "case")) {
    if (!parser->current_switch)
      C_error_tok(parser, tok, "stray case");

    C_Node *node = new_node(parser, ND_CASE, tok);
    int begin = C_const_expr(parser, &tok, tok->next);
    int end;

    if (C_equal(tok, "...")) {
      // [GNU] Case ranges, e.g. "case 1 ... 5:"
      end = C_const_expr(parser, &tok, tok->next);
      if (end < begin)
        C_error_tok(parser, tok, "empty case range specified");
    } else {
      end = begin;
    }

    tok = C_skip(parser, tok, ":");
    node->label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok);
    node->begin = begin;
    node->end = end;
    node->case_next = parser->current_switch->case_next;
    parser->current_switch->case_next = node;
    return node;
  }

  if (C_equal(tok, "default")) {
    if (!parser->current_switch)
      C_error_tok(parser, tok, "stray default");

    C_Node *node = new_node(parser, ND_CASE, tok);
    tok = C_skip(parser, tok->next, ":");
    node->label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok);
    parser->current_switch->default_case = node;
    return node;
  }

  if (C_equal(tok, "for")) {
    C_Node *node = new_node(parser, ND_FOR, tok);
    tok = C_skip(parser, tok->next, "(");

    enter_scope(parser);

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    if (is_typename(parser, tok)) {
      C_Type *basety = declspec(parser, &tok, tok, NULL);
      node->init = declaration(parser, &tok, tok, basety, NULL);
    } else {
      node->init = expr_stmt(parser, &tok, tok);
    }

    if (!C_equal(tok, ";"))
      node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ";");

    if (!C_equal(tok, ")"))
      node->inc = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    node->then = stmt(parser, rest, tok);

    leave_scope(parser);
    parser->brk_label = brk;
    parser->cont_label = cont;
    return node;
  }

  if (C_equal(tok, "while")) {
    C_Node *node = new_node(parser, ND_FOR, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, rest, tok);

    parser->brk_label = brk;
    parser->cont_label = cont;
    return node;
  }

  if (C_equal(tok, "do")) {
    C_Node *node = new_node(parser, ND_DO, tok);

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, &tok, tok->next);

    parser->brk_label = brk;
    parser->cont_label = cont;

    tok = C_skip(parser, tok, "while");
    tok = C_skip(parser, tok, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");
    *rest = C_skip(parser, tok, ";");
    return node;
  }

  if (C_equal(tok, "asm"))
    return asm_stmt(parser, rest, tok);

  if (C_equal(tok, "goto")) {
    if (C_equal(tok->next, "*")) {
      // [GNU] `goto *ptr` jumps to the address specified by `ptr`.
      C_Node *node = new_node(parser, ND_GOTO_EXPR, tok);
      node->lhs = expr(parser, &tok, tok->next->next);
      *rest = C_skip(parser, tok, ";");
      return node;
    }

    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->label = get_ident(parser, tok->next);
    node->goto_next = parser->gotos;
    parser->gotos = node;
    *rest = C_skip(parser, tok->next->next, ";");
    return node;
  }

  if (C_equal(tok, "break")) {
    if (!parser->brk_label)
      C_error_tok(parser, tok, "stray break");
    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->unique_label = parser->brk_label;
    *rest = C_skip(parser, tok->next, ";");
    return node;
  }

  if (C_equal(tok, "continue")) {
    if (!parser->cont_label)
      C_error_tok(parser, tok, "stray continue");
    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->unique_label = parser->cont_label;
    *rest = C_skip(parser, tok->next, ";");
    return node;
  }

  if (tok->kind == TK_IDENT && C_equal(tok->next, ":")) {
    C_Node *node = new_node(parser, ND_LABEL, tok);
    node->label = str_dup(parser->memory_allocator, tok->loc, tok->len);
    node->unique_label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok->next->next);
    node->goto_next = parser->labels;
    parser->labels = node;
    return node;
  }

  if (C_equal(tok, "{"))
    return compound_stmt(parser, rest, tok->next);

  return expr_stmt(parser, rest, tok);
}